

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseSuffixes(StructuralParser *this,Expression *expression)

{
  SourceCodeText *o;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  CommaSeparatedList *args_1;
  long lVar4;
  QualifiedIdentifier *args;
  CallOrCast *pCVar5;
  IdentifierPath local_88;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == ".") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '.')) && (pcVar1[1] == '\0')))) {
    expression = parseDotOperator(this,expression);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
    if (bVar2) {
      args_1 = parseCommaSeparatedListOfExpressions(this,false,false);
      lVar4 = __dynamic_cast(expression,&AST::Expression::typeinfo,&AST::DotOperator::typeinfo,0);
      if (lVar4 == 0) {
        local_88.pathSections.items._0_1_ = 0;
        pCVar5 = PoolAllocator::
                 allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                           (&this->allocator->pool,expression,args_1,(bool *)&local_88);
        expression = parseSuffixes(this,(Expression *)pCVar5);
      }
      else {
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
                  (&args_1->items,(args_1->items).items,
                   (pool_ref<soul::AST::Expression> *)(lVar4 + 0x30));
        lVar4 = *(long *)(lVar4 + 0x38);
        IdentifierPath::IdentifierPath(&local_88,*(string **)(lVar4 + 0x30));
        args = PoolAllocator::
               allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                         (&this->allocator->pool,(Context *)(lVar4 + 0x10),&local_88);
        local_88.pathSections.numActive = 0;
        if ((8 < local_88.pathSections.numAllocated) &&
           ((void *)CONCAT71(local_88.pathSections.items._1_7_,local_88.pathSections.items._0_1_) !=
            (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_88.pathSections.items._1_7_,
                                             local_88.pathSections.items._0_1_));
        }
        local_88.pathSections.items._0_1_ = 1;
        pCVar5 = PoolAllocator::
                 allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                           (&this->allocator->pool,args,args_1,(bool *)&local_88);
        expression = parseSuffixes(this,(Expression *)pCVar5);
      }
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f67c);
      if (bVar2) {
        expression = parseSubscriptWithBrackets(this,expression);
      }
      else {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x25865d);
        if ((bVar2) ||
           (bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ad78),
           bVar3)) {
          expression = parsePostIncDec(this,expression,bVar2);
        }
      }
    }
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return expression;
}

Assistant:

AST::Expression& parseSuffixes (AST::Expression& expression)
    {
        auto context = getContext();

        if (matches (Operator::dot))
            return parseDotOperator (expression);

        if (matchIf (Operator::openParen))
        {
            auto& args = parseCommaSeparatedListOfExpressions (false, false);

            if (auto dot = cast<AST::DotOperator> (expression))
            {
                args.items.insert (args.items.begin(), dot->lhs);
                auto& fn = allocate<AST::QualifiedIdentifier> (dot->rhs.context, IdentifierPath (dot->rhs.identifier));
                return parseSuffixes (allocate<AST::CallOrCast> (fn, args, true));
            }

            return parseSuffixes (allocate<AST::CallOrCast> (expression, args, false));
        }

        if (matchIf (Operator::openBracket))  return parseSubscriptWithBrackets (expression);
        if (matchIf (Operator::plusplus))     return parsePostIncDec (expression, true);
        if (matchIf (Operator::minusminus))   return parsePostIncDec (expression, false);

        return expression;
    }